

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O1

ScalarFunction * duckdb::ToHoursFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_149;
  code *local_148;
  undefined8 uStack_140;
  code *local_138;
  code *pcStack_130;
  LogicalType local_128 [24];
  LogicalType local_110 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_f8;
  LogicalType local_e0 [24];
  BaseScalarFunction local_c8 [176];
  
  duckdb::LogicalType::LogicalType(local_110,BIGINT);
  __l._M_len = 1;
  __l._M_array = local_110;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_f8,__l,&local_149);
  duckdb::LogicalType::LogicalType(local_128,INTERVAL);
  uStack_140 = 0;
  local_148 = ScalarFunction::UnaryFunction<long,duckdb::interval_t,duckdb::ToHoursOperator>;
  pcStack_130 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_138 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_e0,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_e0);
  if (local_138 != (code *)0x0) {
    (*local_138)(&local_148,&local_148,3);
  }
  duckdb::LogicalType::~LogicalType(local_128);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_f8);
  duckdb::LogicalType::~LogicalType(local_110);
  BaseScalarFunction::SetReturnsError(local_c8,&in_RDI->super_BaseScalarFunction);
  duckdb::BaseScalarFunction::~BaseScalarFunction(local_c8);
  return in_RDI;
}

Assistant:

ScalarFunction ToHoursFun::GetFunction() {
	ScalarFunction function({LogicalType::BIGINT}, LogicalType::INTERVAL,
	                        ScalarFunction::UnaryFunction<int64_t, interval_t, ToHoursOperator>);
	BaseScalarFunction::SetReturnsError(function);
	return function;
}